

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O0

double probeChannel_abi_cxx11_(Device *device,int dir,size_t chan)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  ostream *poVar4;
  size_type sVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  ulong in_RCX;
  int in_EDX;
  long *in_RSI;
  char *pcVar9;
  double in_RDI;
  string settings;
  string sensors;
  RangeList bws;
  string freqArgs;
  string name_1;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  freqsList;
  string name;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gainsList;
  string corrections;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  correctionsList;
  string antennas;
  string streamArgs;
  string native;
  double fullScale;
  string formats;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  const_iterator __end2;
  const_iterator __begin2;
  Kwargs *__range2;
  Kwargs info;
  string dirName;
  stringstream ss;
  value_type *in_stack_fffffffffffff798;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff7a0;
  ostream *in_stack_fffffffffffff7b0;
  ostream *in_stack_fffffffffffff978;
  allocator *argInfos;
  char *local_640;
  RangeList *in_stack_fffffffffffff9d8;
  string local_610 [32];
  undefined1 local_5f0 [24];
  string local_5d8 [32];
  string local_5b8 [32];
  undefined1 local_598 [24];
  undefined1 local_580 [24];
  string local_568 [32];
  undefined1 local_548 [24];
  string local_530 [32];
  undefined1 local_510 [24];
  string local_4f8 [32];
  string local_4d8 [32];
  ulong local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  undefined1 local_498 [24];
  string local_480 [32];
  undefined1 local_460 [24];
  string local_448 [32];
  string local_428 [32];
  ulong local_408;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  undefined1 local_3e8 [24];
  string local_3d0 [32];
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [56];
  undefined1 local_300 [24];
  string local_2e8 [32];
  undefined1 local_2c8 [24];
  string local_2b0 [32];
  string local_290 [32];
  double local_270;
  undefined1 local_268 [24];
  string local_250 [32];
  reference local_230;
  _Self local_228;
  _Self local_220;
  undefined1 *local_218;
  undefined1 local_210 [71];
  allocator local_1c9;
  string local_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  ulong local_20;
  int local_14;
  long *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_1a8);
  if (local_14 == 0) {
    local_640 = "TX";
  }
  else {
    local_640 = "RX";
  }
  argInfos = &local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,local_640,argInfos);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::ostream::operator<<(local_198,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_198,"----------------------------------------------------");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(local_198,"-- ");
  poVar3 = std::operator<<(poVar3,local_1c8);
  poVar3 = std::operator<<(poVar3," Channel ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_20);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_198,"----------------------------------------------------");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  (**(code **)(*local_10 + 0x40))(local_210,local_10,local_14,local_20);
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x11c908);
  if (sVar5 != 0) {
    in_stack_fffffffffffff978 = std::operator<<(local_198,"  Channel Information:");
    std::ostream::operator<<(in_stack_fffffffffffff978,std::endl<char,std::char_traits<char>>);
    local_218 = local_210;
    local_220._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffff798);
    local_228._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff798);
    while (bVar1 = std::operator!=(&local_220,&local_228), bVar1) {
      local_230 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)0x11c9ab);
      poVar4 = std::operator<<(local_198,"    ");
      poVar4 = std::operator<<(poVar4,(string *)local_230);
      poVar4 = std::operator<<(poVar4,"=");
      poVar4 = std::operator<<(poVar4,(string *)&local_230->second);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff7a0);
    }
  }
  poVar4 = std::operator<<(local_198,"  Full-duplex: ");
  bVar2 = (**(code **)(*local_10 + 0x48))(local_10,local_14,local_20);
  pcVar9 = "NO";
  if ((bVar2 & 1) != 0) {
    pcVar9 = "YES";
  }
  poVar4 = std::operator<<(poVar4,pcVar9);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_198,"  Supports AGC: ");
  bVar2 = (**(code **)(*local_10 + 0x158))(local_10,local_14,local_20);
  pcVar9 = "NO";
  if ((bVar2 & 1) != 0) {
    pcVar9 = "YES";
  }
  poVar4 = std::operator<<(poVar4,pcVar9);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  (**(code **)(*local_10 + 0x50))(local_268,local_10,local_14,local_20);
  toString<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)poVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar4 = std::operator<<(local_198,"  Stream formats: ");
    poVar4 = std::operator<<(poVar4,local_250);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_270 = 0.0;
  (**(code **)(*local_10 + 0x58))(local_290,local_10,local_14,local_20,&local_270);
  poVar4 = std::operator<<(local_198,"  Native format: ");
  poVar4 = std::operator<<(poVar4,local_290);
  poVar4 = std::operator<<(poVar4," [full-scale=");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_270);
  poVar4 = std::operator<<(poVar4,"]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  (**(code **)(*local_10 + 0x60))(local_2c8,local_10,local_14,local_20);
  toString_abi_cxx11_((ArgInfoList *)argInfos);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)
             in_stack_fffffffffffff7b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar4 = std::operator<<(local_198,"  Stream args:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar4,local_2b0);
  }
  (**(code **)(*local_10 + 0xd8))(local_300,local_10,local_14,local_20);
  toString<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)poVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar4 = std::operator<<(local_198,"  Antennas: ");
    poVar4 = std::operator<<(poVar4,local_2e8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x11cfd3);
  bVar2 = (**(code **)(*local_10 + 0xf0))(local_10,local_14,local_20);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_338,"DC removal",&local_339);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    std::__cxx11::string::~string(local_338);
    std::allocator<char>::~allocator((allocator<char> *)&local_339);
  }
  bVar2 = (**(code **)(*local_10 + 0x108))(local_10,local_14,local_20);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_360,"DC offset",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    std::__cxx11::string::~string(local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
  }
  bVar2 = (**(code **)(*local_10 + 0x120))(local_10,local_14,local_20);
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"IQ balance",&local_389);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
  }
  toString<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)poVar3);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar4 = std::operator<<(local_198,"  Corrections: ");
    poVar4 = std::operator<<(poVar4,local_3b0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<(local_198,"  Full gain range: ");
  (**(code **)(*local_10 + 400))(local_3e8,local_10,local_14,local_20);
  toString_abi_cxx11_((Range *)in_stack_fffffffffffff978);
  poVar4 = std::operator<<(poVar4,local_3d0);
  poVar4 = std::operator<<(poVar4," dB");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_3d0);
  (**(code **)(*local_10 + 0x150))(&local_400,local_10,local_14,local_20);
  for (local_408 = 0; uVar6 = local_408,
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_400), uVar6 < sVar7; local_408 = local_408 + 1) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_400,local_408);
    std::__cxx11::string::string(local_428,(string *)pvVar8);
    poVar4 = std::operator<<(local_198,"    ");
    poVar4 = std::operator<<(poVar4,local_428);
    poVar4 = std::operator<<(poVar4," gain range: ");
    (**(code **)(*local_10 + 0x198))(local_460,local_10,local_14,local_20,local_428);
    toString_abi_cxx11_((Range *)in_stack_fffffffffffff978);
    poVar4 = std::operator<<(poVar4,local_448);
    poVar4 = std::operator<<(poVar4," dB");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::string::~string(local_428);
  }
  poVar4 = std::operator<<(local_198,"  Full freq range: ");
  (**(code **)(*local_10 + 0x1c8))(local_498,local_10,local_14,local_20);
  toString_abi_cxx11_(in_stack_fffffffffffff9d8,in_RDI);
  poVar4 = std::operator<<(poVar4,local_480);
  poVar4 = std::operator<<(poVar4," MHz");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_480);
  std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector
            ((vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)in_stack_fffffffffffff7b0)
  ;
  (**(code **)(*local_10 + 0x1c0))(&local_4b0,local_10,local_14,local_20);
  for (local_4b8 = 0; uVar6 = local_4b8,
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_4b0), uVar6 < sVar7; local_4b8 = local_4b8 + 1) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_4b0,local_4b8);
    std::__cxx11::string::string(local_4d8,(string *)pvVar8);
    poVar4 = std::operator<<(local_198,"    ");
    poVar4 = std::operator<<(poVar4,local_4d8);
    poVar4 = std::operator<<(poVar4," freq range: ");
    (**(code **)(*local_10 + 0x1d0))(local_510,local_10,local_14,local_20,local_4d8);
    toString_abi_cxx11_(in_stack_fffffffffffff9d8,in_RDI);
    poVar4 = std::operator<<(poVar4,local_4f8);
    poVar4 = std::operator<<(poVar4," MHz");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_4f8);
    std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector
              ((vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)
               in_stack_fffffffffffff7b0);
    std::__cxx11::string::~string(local_4d8);
  }
  (**(code **)(*local_10 + 0x1d8))(local_548,local_10,local_14,local_20);
  toString_abi_cxx11_((ArgInfoList *)argInfos);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)
             in_stack_fffffffffffff7b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar4 = std::operator<<(local_198,"  Tune args:");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar4,local_530);
  }
  poVar4 = std::operator<<(local_198,"  Sample rates: ");
  (**(code **)(*local_10 + 0x1f8))(local_580,local_10,local_14,local_20);
  toString_abi_cxx11_(in_stack_fffffffffffff9d8,in_RDI);
  poVar4 = std::operator<<(poVar4,local_568);
  poVar4 = std::operator<<(poVar4," MSps");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_568);
  std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector
            ((vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)in_stack_fffffffffffff7b0)
  ;
  (**(code **)(*local_10 + 0x218))(local_598,local_10,local_14,local_20);
  bVar1 = std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::empty
                    ((vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)
                     in_stack_fffffffffffff7b0);
  if (!bVar1) {
    poVar4 = std::operator<<(local_198,"  Filter bandwidths: ");
    toString_abi_cxx11_(in_stack_fffffffffffff9d8,in_RDI);
    poVar4 = std::operator<<(poVar4,local_5b8);
    poVar4 = std::operator<<(poVar4," MHz");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_5b8);
  }
  (**(code **)(*local_10 + 0x2a0))(local_5f0,local_10,local_14,local_20);
  toString<std::__cxx11::string>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)poVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar3 = std::operator<<(local_198,"  Sensors: ");
    in_stack_fffffffffffff7b0 = std::operator<<(poVar3,local_5d8);
    std::ostream::operator<<(in_stack_fffffffffffff7b0,std::endl<char,std::char_traits<char>>);
  }
  (**(code **)(*local_10 + 0x308))(&stack0xfffffffffffff9d8,local_10,local_14,local_20);
  toString_abi_cxx11_((ArgInfoList *)argInfos);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)
             in_stack_fffffffffffff7b0);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    poVar3 = std::operator<<(local_198,"  Other Settings:");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::operator<<(poVar3,local_610);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_610);
  std::__cxx11::string::~string(local_5d8);
  std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~vector
            ((vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)in_stack_fffffffffffff7b0)
  ;
  std::__cxx11::string::~string(local_530);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7b0);
  std::__cxx11::string::~string(local_3b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7b0);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_2b0);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_250);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x11df67);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

static std::string probeChannel(SoapySDR::Device *device, const int dir, const size_t chan)
{
    std::stringstream ss;

    std::string dirName = (dir==SOAPY_SDR_TX)?"TX":"RX";
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- " << dirName << " Channel " << chan << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    // info
    const auto info = device->getChannelInfo(dir, chan);
    if (info.size() > 0)
    {
        ss << "  Channel Information:" << std::endl;
        for (const auto &it : info)
        {
            ss << "    " << it.first << "=" << it.second << std::endl;
        }
    }

    ss << "  Full-duplex: " << (device->getFullDuplex(dir, chan)?"YES":"NO") << std::endl;
    ss << "  Supports AGC: " << (device->hasGainMode(dir, chan)?"YES":"NO") << std::endl;

    //formats
    std::string formats = toString(device->getStreamFormats(dir, chan));
    if (not formats.empty()) ss << "  Stream formats: " << formats << std::endl;

    //native
    double fullScale = 0.0;
    std::string native = device->getNativeStreamFormat(dir, chan, fullScale);
    ss << "  Native format: " << native << " [full-scale=" << fullScale << "]" << std::endl;    

    //stream args
    std::string streamArgs = toString(device->getStreamArgsInfo(dir, chan));
    if (not streamArgs.empty()) ss << "  Stream args:" << std::endl << streamArgs;

    //antennas
    std::string antennas = toString(device->listAntennas(dir, chan));
    if (not antennas.empty()) ss << "  Antennas: " << antennas << std::endl;

    //corrections
    std::vector<std::string> correctionsList;
    if (device->hasDCOffsetMode(dir, chan)) correctionsList.push_back("DC removal");
    if (device->hasDCOffset(dir, chan)) correctionsList.push_back("DC offset");
    if (device->hasIQBalance(dir, chan)) correctionsList.push_back("IQ balance");
    std::string corrections = toString(correctionsList);
    if (not corrections.empty()) ss << "  Corrections: " << corrections << std::endl;

    //gains
    ss << "  Full gain range: " << toString(device->getGainRange(dir, chan)) << " dB" << std::endl;
    std::vector<std::string> gainsList = device->listGains(dir, chan);
    for (size_t i = 0; i < gainsList.size(); i++)
    {
        const std::string name = gainsList[i];
        ss << "    " << name << " gain range: " << toString(device->getGainRange(dir, chan, name)) << " dB" << std::endl;
    }

    //frequencies
    ss << "  Full freq range: " << toString(device->getFrequencyRange(dir, chan), 1e6) << " MHz" << std::endl;
    std::vector<std::string> freqsList = device->listFrequencies(dir, chan);
    for (size_t i = 0; i < freqsList.size(); i++)
    {
        const std::string name = freqsList[i];
        ss << "    " << name << " freq range: " << toString(device->getFrequencyRange(dir, chan, name), 1e6) << " MHz" << std::endl;
    }

    //freq args
    std::string freqArgs = toString(device->getFrequencyArgsInfo(dir, chan));
    if (not freqArgs.empty()) ss << "  Tune args:" << std::endl << freqArgs;

    //rates
    ss << "  Sample rates: " << toString(device->getSampleRateRange(dir, chan), 1e6) << " MSps" << std::endl;

    //bandwidths
    const auto bws = device->getBandwidthRange(dir, chan);
    if (not bws.empty()) ss << "  Filter bandwidths: " << toString(bws, 1e6) << " MHz" << std::endl;

    //sensors
    std::string sensors = toString(device->listSensors(dir, chan));
    if (not sensors.empty()) ss << "  Sensors: " << sensors << std::endl;

    //settings
    std::string settings = toString(device->getSettingInfo(dir, chan));
    if (not settings.empty()) ss << "  Other Settings:" << std::endl << settings;

    return ss.str();
}